

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

void google::Append(State *state,char *str,int length)

{
  int local_20;
  int i;
  int length_local;
  char *str_local;
  State *state_local;
  
  local_20 = 0;
  do {
    if (length <= local_20) {
LAB_0012f6f2:
      if ((state->overflowed & 1U) == 0) {
        *state->out_cur = '\0';
      }
      return;
    }
    if (state->out_end <= state->out_cur + 1) {
      state->overflowed = true;
      goto LAB_0012f6f2;
    }
    *state->out_cur = str[local_20];
    state->out_cur = state->out_cur + 1;
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

static void Append(State *state, const char * const str, const int length) {
  int i;
  for (i = 0; i < length; ++i) {
    if (state->out_cur + 1 < state->out_end) {  // +1 for '\0'
      *state->out_cur = str[i];
      ++state->out_cur;
    } else {
      state->overflowed = true;
      break;
    }
  }
  if (!state->overflowed) {
    *state->out_cur = '\0';  // Terminate it with '\0'
  }
}